

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_buffer.c
# Opt level: O0

void test_cio_write_buffer_split_and_append(void)

{
  int iVar1;
  uint uVar2;
  cio_write_buffer *pcVar3;
  char *pcVar4;
  ulong expected;
  size_t sVar5;
  cio_write_buffer *local_190;
  cio_write_buffer *remaining_buffer_in_append_list;
  cio_write_buffer *remaining_buffer_in_split_list;
  char local_178 [4];
  int ret_3;
  char buf_1 [100];
  uint i_4;
  int ret_2;
  char buf [100];
  uint local_9c;
  uint i_3;
  uint i_2;
  cio_write_buffer *e;
  int ret_1;
  char *data_1;
  cio_write_buffer *wbe_1;
  undefined1 auStack_70 [4];
  uint i_1;
  cio_write_buffer wbh_to_append;
  int ret;
  char *data;
  cio_write_buffer *wbe;
  undefined1 auStack_30 [4];
  uint i;
  cio_write_buffer wbh_to_split;
  uint split_position;
  
  wbh_to_split.data.element.length._4_4_ = 0;
  do {
    if (5 < (uint)wbh_to_split.data.element.length._4_4_) {
      return;
    }
    cio_write_buffer_head_init((cio_write_buffer *)auStack_30);
    for (wbe._4_4_ = 0; wbe._4_4_ < 6; wbe._4_4_ = wbe._4_4_ + 1) {
      pcVar3 = (cio_write_buffer *)malloc(0x20);
      if (pcVar3 == (cio_write_buffer *)0x0) {
        UnityFail("allocation of writebuffer element failed!",0x11d);
      }
      pcVar4 = (char *)malloc(100);
      if (pcVar4 == (char *)0x0) {
        UnityFail("allocation of writebuffer data element failed!",0x11f);
      }
      wbh_to_append.data.element.length._4_4_ = snprintf(pcVar4,99,"SL_BUFFER%u",(ulong)wbe._4_4_);
      if (99 < (int)wbh_to_append.data.element.length._4_4_) {
        UnityFail("Write buffer for split list not filled correctly!",0x122);
      }
      cio_write_buffer_element_init(pcVar3,pcVar4,100);
      cio_write_buffer_queue_tail((cio_write_buffer *)auStack_30,pcVar3);
    }
    cio_write_buffer_head_init((cio_write_buffer *)auStack_70);
    for (wbe_1._4_4_ = 0; wbe_1._4_4_ < 2; wbe_1._4_4_ = wbe_1._4_4_ + 1) {
      pcVar3 = (cio_write_buffer *)malloc(0x20);
      if (pcVar3 == (cio_write_buffer *)0x0) {
        UnityFail("allocation of writebuffer element failed!",0x12d);
      }
      pcVar4 = (char *)malloc(100);
      if (pcVar4 == (char *)0x0) {
        UnityFail("allocation of writebuffer data element failed!",0x12f);
      }
      iVar1 = snprintf(pcVar4,99,"AL_BUFFER%u",(ulong)wbe_1._4_4_);
      if (99 < iVar1) {
        UnityFail("Write buffer for append list not filled correctly!",0x132);
      }
      cio_write_buffer_element_init(pcVar3,pcVar4,100);
      cio_write_buffer_queue_tail((cio_write_buffer *)auStack_70,pcVar3);
    }
    _i_3 = (cio_write_buffer *)auStack_30;
    for (local_9c = 0; local_9c <= (uint)wbh_to_split.data.element.length._4_4_;
        local_9c = local_9c + 1) {
      _i_3 = _i_3->next;
    }
    cio_write_buffer_split_and_append
              ((cio_write_buffer *)auStack_70,(cio_write_buffer *)auStack_30,_i_3);
    expected = (ulong)(uint)wbh_to_split.data.element.length._4_4_;
    sVar5 = cio_write_buffer_get_num_buffer_elements((cio_write_buffer *)auStack_30);
    UnityAssertEqualNumber
              (expected,sVar5,"Number of elements in splitted list not correct!",0x13f,
               UNITY_DISPLAY_STYLE_INT);
    uVar2 = wbh_to_split.data.element.length._4_4_ * 100;
    sVar5 = cio_write_buffer_get_total_size((cio_write_buffer *)auStack_30);
    UnityAssertEqualNumber
              ((ulong)uVar2,sVar5,"Total size of splitted list not correct!",0x140,
               UNITY_DISPLAY_STYLE_INT);
    uVar2 = 8 - wbh_to_split.data._12_4_;
    sVar5 = cio_write_buffer_get_num_buffer_elements((cio_write_buffer *)auStack_70);
    UnityAssertEqualNumber
              ((ulong)uVar2,sVar5,"Number of elements in appended list not correct!",0x141,
               UNITY_DISPLAY_STYLE_INT);
    iVar1 = 8 - wbh_to_split.data._12_4_;
    sVar5 = cio_write_buffer_get_total_size((cio_write_buffer *)auStack_70);
    UnityAssertEqualNumber
              ((ulong)(uint)(iVar1 * 100),sVar5,"Total size of appended list not correct!",0x142,
               UNITY_DISPLAY_STYLE_INT);
    _i_3 = _auStack_70;
    buf[0x60] = '\0';
    buf[0x61] = '\0';
    buf[0x62] = '\0';
    buf[99] = '\0';
    for (; (uint)buf._96_4_ < 2; buf._96_4_ = buf._96_4_ + 1) {
      iVar1 = snprintf((char *)&i_4,100,"AL_BUFFER%u",(ulong)(uint)buf._96_4_);
      if (99 < iVar1) {
        UnityFail("Check buffer for append list not filled correctly!",0x149);
      }
      UnityAssertEqualString
                ((char *)&i_4,(char *)(_i_3->data).element.field_0.const_data,
                 "Data in merged append buffer not correct!",0x14b);
      _i_3 = _i_3->next;
    }
    buf_1[0x60] = wbh_to_split.data._12_1_;
    buf_1[0x61] = wbh_to_split.data._13_1_;
    buf_1[0x62] = wbh_to_split.data._14_1_;
    buf_1[99] = wbh_to_split.data._15_1_;
    for (; (uint)buf_1._96_4_ < 6; buf_1._96_4_ = buf_1._96_4_ + 1) {
      iVar1 = snprintf(local_178,100,"SL_BUFFER%u",(ulong)(uint)buf_1._96_4_);
      if (99 < iVar1) {
        UnityFail("Check buffer for split list not filled correctly!",0x152);
      }
      UnityAssertEqualString
                (local_178,(char *)(_i_3->data).element.field_0.const_data,
                 "Data in merged split buffer not correct!",0x154);
      _i_3 = _i_3->next;
    }
    remaining_buffer_in_append_list = cio_write_buffer_queue_dequeue((cio_write_buffer *)auStack_30)
    ;
    while (remaining_buffer_in_append_list != (cio_write_buffer *)0x0) {
      free((remaining_buffer_in_append_list->data).element.field_0.const_data);
      free(remaining_buffer_in_append_list);
      remaining_buffer_in_append_list =
           cio_write_buffer_queue_dequeue((cio_write_buffer *)auStack_30);
    }
    local_190 = cio_write_buffer_queue_dequeue((cio_write_buffer *)auStack_70);
    while (local_190 != (cio_write_buffer *)0x0) {
      free((local_190->data).element.field_0.const_data);
      free(local_190);
      local_190 = cio_write_buffer_queue_dequeue((cio_write_buffer *)auStack_70);
    }
    wbh_to_split.data.element.length._4_4_ = wbh_to_split.data.element.length._4_4_ + 1;
  } while( true );
}

Assistant:

static void test_cio_write_buffer_split_and_append(void)
{
	enum { SPLIT_LIST_LENGTH = 6 };
	for (unsigned int split_position = 0; split_position < SPLIT_LIST_LENGTH; split_position++) {
		struct cio_write_buffer wbh_to_split;
		cio_write_buffer_head_init(&wbh_to_split);

		enum { DATA_BUFFER_LENGTH = 100 };
		for (unsigned int i = 0; i < SPLIT_LIST_LENGTH; i++) {
			struct cio_write_buffer *wbe = malloc(sizeof(*wbe));
			TEST_ASSERT_NOT_NULL_MESSAGE(wbe, "allocation of writebuffer element failed!");
			char *data = malloc(DATA_BUFFER_LENGTH);
			TEST_ASSERT_NOT_NULL_MESSAGE(data, "allocation of writebuffer data element failed!");
			int ret = snprintf(data, DATA_BUFFER_LENGTH - 1, "SL_BUFFER%u", i);
			if (ret >= DATA_BUFFER_LENGTH) {
				TEST_FAIL_MESSAGE("Write buffer for split list not filled correctly!");
			}
			cio_write_buffer_element_init(wbe, data, DATA_BUFFER_LENGTH);
			cio_write_buffer_queue_tail(&wbh_to_split, wbe);
		}

		struct cio_write_buffer wbh_to_append;
		cio_write_buffer_head_init(&wbh_to_append);
		enum { APPEND_LIST_LENGTH = 2 };
		for (unsigned int i = 0; i < APPEND_LIST_LENGTH; i++) {
			struct cio_write_buffer *wbe = malloc(sizeof(*wbe));
			TEST_ASSERT_NOT_NULL_MESSAGE(wbe, "allocation of writebuffer element failed!");
			char *data = malloc(DATA_BUFFER_LENGTH);
			TEST_ASSERT_NOT_NULL_MESSAGE(data, "allocation of writebuffer data element failed!");
			int ret = snprintf(data, DATA_BUFFER_LENGTH - 1, "AL_BUFFER%u", i);
			if (ret >= DATA_BUFFER_LENGTH) {
				TEST_FAIL_MESSAGE("Write buffer for append list not filled correctly!");
			}
			cio_write_buffer_element_init(wbe, data, DATA_BUFFER_LENGTH);
			cio_write_buffer_queue_tail(&wbh_to_append, wbe);
		}

		struct cio_write_buffer *e = &wbh_to_split;

		for (unsigned int i = 0; i <= split_position; i++) {
			e = e->next;
		}

		cio_write_buffer_split_and_append(&wbh_to_append, &wbh_to_split, e);
		TEST_ASSERT_EQUAL_MESSAGE(split_position, cio_write_buffer_get_num_buffer_elements(&wbh_to_split), "Number of elements in splitted list not correct!");
		TEST_ASSERT_EQUAL_MESSAGE(split_position * DATA_BUFFER_LENGTH, cio_write_buffer_get_total_size(&wbh_to_split), "Total size of splitted list not correct!");
		TEST_ASSERT_EQUAL_MESSAGE(APPEND_LIST_LENGTH + (SPLIT_LIST_LENGTH - split_position), cio_write_buffer_get_num_buffer_elements(&wbh_to_append), "Number of elements in appended list not correct!");
		TEST_ASSERT_EQUAL_MESSAGE((APPEND_LIST_LENGTH + (SPLIT_LIST_LENGTH - split_position)) * DATA_BUFFER_LENGTH, cio_write_buffer_get_total_size(&wbh_to_append), "Total size of appended list not correct!");

		e = wbh_to_append.next;
		for (unsigned i = 0; i < APPEND_LIST_LENGTH; i++) {
			char buf[DATA_BUFFER_LENGTH];
			int ret = snprintf(buf, sizeof(buf), "AL_BUFFER%u", i);
			if (ret >= DATA_BUFFER_LENGTH) {
				TEST_FAIL_MESSAGE("Check buffer for append list not filled correctly!");
			}
			TEST_ASSERT_EQUAL_STRING_MESSAGE(buf, e->data.element.data, "Data in merged append buffer not correct!");
			e = e->next;
		}
		for (unsigned i = split_position; i < SPLIT_LIST_LENGTH; i++) {
			char buf[DATA_BUFFER_LENGTH];
			int ret = snprintf(buf, sizeof(buf), "SL_BUFFER%u", i);
			if (ret >= DATA_BUFFER_LENGTH) {
				TEST_FAIL_MESSAGE("Check buffer for split list not filled correctly!");
			}
			TEST_ASSERT_EQUAL_STRING_MESSAGE(buf, e->data.element.data, "Data in merged split buffer not correct!");
			e = e->next;
		}

		struct cio_write_buffer *remaining_buffer_in_split_list = cio_write_buffer_queue_dequeue(&wbh_to_split);
		while (remaining_buffer_in_split_list != NULL) {
			free(remaining_buffer_in_split_list->data.element.data);
			free(remaining_buffer_in_split_list);
			remaining_buffer_in_split_list = cio_write_buffer_queue_dequeue(&wbh_to_split);
		}

		struct cio_write_buffer *remaining_buffer_in_append_list = cio_write_buffer_queue_dequeue(&wbh_to_append);
		while (remaining_buffer_in_append_list != NULL) {
			free(remaining_buffer_in_append_list->data.element.data);
			free(remaining_buffer_in_append_list);
			remaining_buffer_in_append_list = cio_write_buffer_queue_dequeue(&wbh_to_append);
		}
	}
}